

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

int Acb_NtkFindSupp2(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp,int nLutSize,int fDelay)

{
  ulong uVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  lit lVar5;
  int *piVar6;
  int *piVar7;
  lit *plVar8;
  bool bVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  char *__assertion;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  
  if (Pivot < 1) {
LAB_0037bde3:
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if (Pivot < (p->vObjFans).nSize) {
    piVar6 = (p->vObjFans).pArray;
    iVar12 = piVar6[(uint)Pivot];
    if (((long)iVar12 < 0) || ((p->vFanSto).nSize <= iVar12)) {
LAB_0037bda5:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar7 = (p->vFanSto).pArray;
    puVar2 = (uint *)(piVar7 + iVar12);
    uVar20 = 0;
    uVar16 = (ulong)*puVar2;
    if ((int)*puVar2 < 1) {
      uVar16 = uVar20;
    }
    while (uVar16 != uVar20) {
      uVar13 = puVar2[uVar20 + 1];
      if ((long)(int)uVar13 < 1) goto LAB_0037bd29;
      iVar12 = (p->vObjFunc).nSize;
      if (iVar12 < 1) goto LAB_0037bd20;
      if (iVar12 <= (int)uVar13) goto LAB_0037bd01;
      iVar12 = (p->vObjFunc).pArray[(int)uVar13];
      if ((iVar12 < 0) || (uVar20 = uVar20 + 1, nDivs <= iVar12)) {
        __assert_fail("Acb_ObjFunc(p, iFanin) >= 0 && Acb_ObjFunc(p, iFanin) < nDivs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0x3ab,
                      "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
    }
    if (fDelay == 0) {
      if (0 < (int)*puVar2) {
        lVar17 = 0;
        do {
          uVar13 = puVar2[lVar17 + 1];
          lVar22 = (long)(int)uVar13;
          if (lVar22 < 1) {
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
          }
          if ((p->vObjType).nSize <= (int)uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if ((p->vObjType).pArray[lVar22] != '\x03') {
            if ((p->vFanouts).nSize <= (int)uVar13) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            if ((p->vFanouts).pArray[lVar22].nSize == 1) {
              vSupp->nSize = 0;
              if ((p->vObjFans).nSize <= Pivot) goto LAB_0037bd01;
              iVar12 = (p->vObjFans).pArray[(uint)Pivot];
              lVar14 = (long)iVar12;
              if ((lVar14 < 0) || ((p->vFanSto).nSize <= iVar12)) goto LAB_0037bda5;
              piVar6 = (p->vFanSto).pArray;
              if (0 < piVar6[lVar14]) {
                lVar21 = 0;
                do {
                  if (uVar13 != piVar6[lVar14 + lVar21 + 1]) {
                    Vec_IntPush(vSupp,piVar6[lVar14 + lVar21 + 1]);
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 < piVar6[lVar14]);
              }
              if ((p->vObjFans).nSize <= (int)uVar13) goto LAB_0037bd01;
              iVar12 = (p->vObjFans).pArray[lVar22];
              lVar22 = (long)iVar12;
              if ((lVar22 < 0) || ((p->vFanSto).nSize <= iVar12)) goto LAB_0037bda5;
              piVar6 = (p->vFanSto).pArray;
              if (0 < piVar6[lVar22]) {
                piVar6 = piVar6 + lVar22;
                lVar22 = 0;
                do {
                  iVar12 = piVar6[lVar22 + 1];
                  if (0 < (long)vSupp->nSize) {
                    lVar14 = 0;
                    do {
                      if (vSupp->pArray[lVar14] == iVar12) goto LAB_0037ba6e;
                      lVar14 = lVar14 + 1;
                    } while (vSupp->nSize != lVar14);
                  }
                  Vec_IntPush(vSupp,iVar12);
LAB_0037ba6e:
                  lVar22 = lVar22 + 1;
                } while (lVar22 < *piVar6);
              }
              plVar8 = vSupp->pArray;
              iVar12 = vSupp->nSize;
              if (1 < (long)iVar12) {
                uVar20 = 1;
                uVar16 = 0;
                do {
                  uVar1 = uVar16 + 1;
                  uVar19 = uVar16 & 0xffffffff;
                  uVar18 = uVar20;
                  do {
                    iVar11 = plVar8[uVar18];
                    if (((long)iVar11 < 0) || (iVar3 = (p->vLevelD).nSize, iVar3 <= iVar11))
                    goto LAB_0037bd01;
                    iVar4 = plVar8[(int)uVar19];
                    if (((long)iVar4 < 0) || (iVar3 <= iVar4)) goto LAB_0037bd01;
                    piVar6 = (p->vLevelD).pArray;
                    uVar10 = uVar18 & 0xffffffff;
                    if (piVar6[iVar4] <= piVar6[iVar11]) {
                      uVar10 = uVar19;
                    }
                    uVar19 = uVar10;
                    uVar18 = uVar18 + 1;
                  } while ((long)iVar12 != uVar18);
                  lVar5 = plVar8[uVar16];
                  plVar8[uVar16] = plVar8[(int)uVar19];
                  plVar8[(int)uVar19] = lVar5;
                  uVar20 = uVar20 + 1;
                  uVar16 = uVar1;
                } while (uVar1 != iVar12 - 1);
              }
              if (0 < vSupp->nSize) {
                lVar22 = 0;
                do {
                  iVar12 = plVar8[lVar22];
                  if ((long)iVar12 < 1) goto LAB_0037bd29;
                  iVar11 = (p->vObjFunc).nSize;
                  if (iVar11 < 1) goto LAB_0037bd20;
                  if (iVar11 <= iVar12) goto LAB_0037bd01;
                  iVar12 = (p->vObjFunc).pArray[iVar12];
                  if (iVar12 < 0) {
                    __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                  ,0x382,
                                  "void Acb_NtkRemapIntoSatVariables(Acb_Ntk_t *, Vec_Int_t *)");
                  }
                  plVar8[lVar22] = iVar12;
                  lVar22 = lVar22 + 1;
                } while (lVar22 < vSupp->nSize);
              }
              if (0 < vSupp->nSize) {
                lVar22 = 0;
                do {
                  iVar12 = plVar8[lVar22] + nVars * 2;
                  if (iVar12 < 0) goto LAB_0037bd67;
                  plVar8[lVar22] = iVar12 * 2;
                  lVar22 = lVar22 + 1;
                } while (lVar22 < vSupp->nSize);
              }
              iVar12 = sat_solver_solve(pSat,plVar8,plVar8 + vSupp->nSize,0,0,0,0);
              if (iVar12 != -1) {
                printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
                __assert_fail("status == l_False",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                              ,0x3e5,
                              "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              iVar12 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
              if (vSupp->nSize < iVar12) {
LAB_0037be5f:
                __assert_fail("p->nSize >= nSizeNew",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
              }
              vSupp->nSize = iVar12;
              if (0 < iVar12) {
                piVar6 = vSupp->pArray;
                lVar22 = 0;
                do {
                  uVar13 = piVar6[lVar22];
                  if ((int)uVar13 < 0) goto LAB_0037bd48;
                  piVar6[lVar22] = (uVar13 >> 1) + nVars * -2;
                  lVar22 = lVar22 + 1;
                } while (lVar22 < vSupp->nSize);
              }
              if (vSupp->nSize <= nLutSize) {
                return 1;
              }
            }
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < (int)*puVar2);
      }
      return 0;
    }
    if (Pivot < (p->vLevelD).nSize) {
      if ((p->vLevelD).pArray[(uint)Pivot] < 2) {
        __assert_fail("Acb_ObjLevelD( p, Pivot ) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0x3b0,
                      "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
      vSupp->nSize = 0;
      if (Pivot < (p->vObjFans).nSize) {
        iVar12 = piVar6[(uint)Pivot];
        lVar17 = (long)iVar12;
        if ((-1 < lVar17) && (iVar12 < (p->vFanSto).nSize)) {
          if (0 < piVar7[lVar17]) {
            lVar22 = 0;
            do {
              iVar12 = piVar7[lVar17 + lVar22 + 1];
              iVar11 = Acb_ObjIsDelayCriticalFanin(p,Pivot,iVar12);
              if (iVar11 == 0) {
                Vec_IntPush(vSupp,iVar12);
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 < piVar7[lVar17]);
          }
          if ((p->vObjFans).nSize <= Pivot) goto LAB_0037bd01;
          iVar12 = (p->vObjFans).pArray[(uint)Pivot];
          lVar17 = (long)iVar12;
          if ((lVar17 < 0) || ((p->vFanSto).nSize <= iVar12)) goto LAB_0037bda5;
          iVar12 = vSupp->nSize;
          piVar6 = (p->vFanSto).pArray;
          if (0 < piVar6[lVar17]) {
            piVar6 = piVar6 + lVar17;
            lVar17 = 0;
            do {
              uVar13 = piVar6[lVar17 + 1];
              iVar11 = Acb_ObjIsDelayCriticalFanin(p,Pivot,uVar13);
              if (iVar11 != 0) {
                if ((int)uVar13 < 1) goto LAB_0037bde3;
                if ((p->vObjFans).nSize <= (int)uVar13) goto LAB_0037bd01;
                iVar11 = (p->vObjFans).pArray[uVar13];
                lVar22 = (long)iVar11;
                if ((lVar22 < 0) || ((p->vFanSto).nSize <= iVar11)) goto LAB_0037bda5;
                piVar7 = (p->vFanSto).pArray;
                if (0 < piVar7[lVar22]) {
                  piVar7 = piVar7 + lVar22;
                  lVar22 = 0;
                  do {
                    iVar11 = piVar7[lVar22 + 1];
                    if (0 < (long)vSupp->nSize) {
                      lVar14 = 0;
                      do {
                        if (vSupp->pArray[lVar14] == iVar11) goto LAB_0037b7ce;
                        lVar14 = lVar14 + 1;
                      } while (vSupp->nSize != lVar14);
                    }
                    Vec_IntPush(vSupp,iVar11);
LAB_0037b7ce:
                    lVar22 = lVar22 + 1;
                  } while (lVar22 < *piVar7);
                }
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < *piVar6);
          }
          if (vSupp->nSize <= iVar12) {
            __assert_fail("nNonCrits < Vec_IntSize(vSupp)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                          ,0x3bb,
                          "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                         );
          }
          plVar8 = vSupp->pArray;
          uVar13 = vSupp->nSize - iVar12;
          if (1 < (int)uVar13) {
            uVar20 = 1;
            uVar16 = 0;
            do {
              uVar1 = uVar16 + 1;
              uVar19 = uVar16 & 0xffffffff;
              uVar18 = uVar20;
              do {
                iVar11 = plVar8[(long)iVar12 + uVar18];
                if (((long)iVar11 < 0) || (iVar3 = (p->vLevelD).nSize, iVar3 <= iVar11))
                goto LAB_0037bd01;
                iVar4 = plVar8[(long)iVar12 + (long)(int)(uint)uVar19];
                if (((long)iVar4 < 0) || (iVar3 <= iVar4)) goto LAB_0037bd01;
                piVar6 = (p->vLevelD).pArray;
                uVar15 = (uint)uVar18;
                if (piVar6[iVar4] <= piVar6[iVar11]) {
                  uVar15 = (uint)uVar19;
                }
                uVar18 = uVar18 + 1;
                uVar19 = (ulong)uVar15;
              } while (uVar13 != uVar18);
              lVar5 = plVar8[(long)iVar12 + uVar16];
              plVar8[(long)iVar12 + uVar16] = plVar8[(long)iVar12 + (long)(int)uVar15];
              plVar8[(long)iVar12 + (long)(int)uVar15] = lVar5;
              uVar20 = uVar20 + 1;
              uVar16 = uVar1;
            } while (uVar1 != uVar13 - 1);
          }
          if (vSupp->nSize < 1) {
            bVar9 = false;
          }
          else {
            lVar17 = 0;
            do {
              iVar12 = plVar8[lVar17];
              if ((long)iVar12 < 1) {
LAB_0037bd29:
                __assertion = "i>0";
LAB_0037bd30:
                __assert_fail(__assertion,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                              ,0x109,"int Acb_ObjFunc(Acb_Ntk_t *, int)");
              }
              iVar11 = (p->vObjFunc).nSize;
              if (iVar11 < 1) {
LAB_0037bd20:
                __assertion = "Acb_NtkHasObjFuncs(p)";
                goto LAB_0037bd30;
              }
              if (iVar11 <= iVar12) goto LAB_0037bd01;
              iVar12 = (p->vObjFunc).pArray[iVar12];
              if (iVar12 < 0) {
                __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                              ,0x3c1,
                              "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              plVar8[lVar17] = iVar12;
              lVar17 = lVar17 + 1;
            } while (lVar17 < vSupp->nSize);
            bVar9 = 0 < vSupp->nSize;
          }
          if (bVar9) {
            lVar17 = 0;
            do {
              iVar12 = plVar8[lVar17] + nVars * 2;
              if (iVar12 < 0) {
LAB_0037bd67:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              plVar8[lVar17] = iVar12 * 2;
              lVar17 = lVar17 + 1;
            } while (lVar17 < vSupp->nSize);
          }
          iVar12 = sat_solver_solve(pSat,plVar8,plVar8 + vSupp->nSize,0,0,0,0);
          if (iVar12 != -1) {
            printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
            __assert_fail("status == l_False",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                          ,0x3c9,
                          "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                         );
          }
          iVar12 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
          if (iVar12 <= vSupp->nSize) {
            vSupp->nSize = iVar12;
            if (0 < iVar12) {
              piVar6 = vSupp->pArray;
              lVar17 = 0;
              do {
                uVar13 = piVar6[lVar17];
                if ((int)uVar13 < 0) {
LAB_0037bd48:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                piVar6[lVar17] = (uVar13 >> 1) + nVars * -2;
                lVar17 = lVar17 + 1;
              } while (lVar17 < vSupp->nSize);
            }
            return (uint)(vSupp->nSize <= nLutSize);
          }
          goto LAB_0037be5f;
        }
        goto LAB_0037bda5;
      }
    }
  }
LAB_0037bd01:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Acb_NtkFindSupp2( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp, int nLutSize, int fDelay )
{
    int nSuppNew, status, k, iFanin, * pFanins, k2, iFanin2, * pFanins2;
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        assert( Acb_ObjFunc(p, iFanin) >= 0 && Acb_ObjFunc(p, iFanin) < nDivs );
    if ( fDelay )
    {
        // add non-timing-critical fanins
        int nNonCrits, k2, iFanin2 = 0, * pFanins2;
        assert( Acb_ObjLevelD( p, Pivot ) > 1 );
        Vec_IntClear( vSupp );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( !Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                Vec_IntPush( vSupp, iFanin );
        nNonCrits = Vec_IntSize(vSupp);
        // add fanins of timing critical fanins
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
                    Vec_IntPushUnique( vSupp, iFanin2 );
        assert( nNonCrits < Vec_IntSize(vSupp) );
        // sort additional fanins by level
        Vec_IntSelectSortCost( Vec_IntArray(vSupp) + nNonCrits, Vec_IntSize(vSupp) - nNonCrits, &p->vLevelD );
        // translate to SAT vars
        Vec_IntForEachEntry( vSupp, iFanin, k )
        {
            assert( Acb_ObjFunc(p, iFanin) >= 0 );
            Vec_IntWriteEntry( vSupp, k, Acb_ObjFunc(p, iFanin) );
        }
        // solve for these fanins
        Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status != l_False )
            printf( "Failed internal check at node %d.\n", Pivot );
        assert( status == l_False );
        nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
        Vec_IntShrink( vSupp, nSuppNew );
        Vec_IntLits2Vars( vSupp, -2*nVars );
        return Vec_IntSize(vSupp) <= nLutSize;
    }
    // iterate through different fanout free cones
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        // collect fanins of the root node
        Vec_IntClear( vSupp );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins2, iFanin2, k2 )
            if ( iFanin != iFanin2 )
                Vec_IntPush( vSupp, iFanin2 );
        // collect fanins of the selected node
        Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
            Vec_IntPushUnique( vSupp, iFanin2 );
        // sort fanins by level
        Vec_IntSelectSortCost( Vec_IntArray(vSupp), Vec_IntSize(vSupp), &p->vLevelD );
        //Acb_NtkOrderByRefCount( p, vSupp );
        Acb_NtkRemapIntoSatVariables( p, vSupp );
        // solve for these fanins
        Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status != l_False )
            printf( "Failed internal check at node %d.\n", Pivot );
        assert( status == l_False );
        nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
        Vec_IntShrink( vSupp, nSuppNew );
        Vec_IntLits2Vars( vSupp, -2*nVars );
        if ( Vec_IntSize(vSupp) <= nLutSize )
            return 1;
    }
    return 0;
}